

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_filter_alloc(AV1LfSync *lf_sync,AV1_COMMON *cm,int rows,int width,int num_workers)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int j_1;
  int j;
  int i;
  int local_28;
  int local_24;
  int local_20;
  
  *(int *)(in_RDI + 0x4c) = in_EDX;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pvVar2 = aom_malloc(0x6de98a);
    *(void **)(in_RDI + (long)local_24 * 8) = pvVar2;
    if (*(long *)(in_RDI + (long)local_24 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lf_sync->mutex_[j]");
    }
    if (*(long *)(in_RDI + (long)local_24 * 8) != 0) {
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
        pthread_mutex_init((pthread_mutex_t *)
                           (*(long *)(in_RDI + (long)local_24 * 8) + (long)local_20 * 0x28),
                           (pthread_mutexattr_t *)0x0);
      }
    }
    pvVar2 = aom_malloc(0x6dea2f);
    *(void **)(in_RDI + 0x18 + (long)local_24 * 8) = pvVar2;
    if (*(long *)(in_RDI + 0x18 + (long)local_24 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lf_sync->cond_[j]");
    }
    if (*(long *)(in_RDI + 0x18 + (long)local_24 * 8) != 0) {
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
        pthread_cond_init((pthread_cond_t *)
                          (*(long *)(in_RDI + 0x18 + (long)local_24 * 8) + (long)local_20 * 0x30),
                          (pthread_condattr_t *)0x0);
      }
    }
  }
  pvVar2 = aom_malloc(0x6deae6);
  *(void **)(in_RDI + 0x60) = pvVar2;
  if (*(long *)(in_RDI + 0x60) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lf_sync->job_mutex");
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    pthread_mutex_init(*(pthread_mutex_t **)(in_RDI + 0x60),(pthread_mutexattr_t *)0x0);
  }
  pvVar2 = aom_malloc(0x6deb4d);
  *(void **)(in_RDI + 0x50) = pvVar2;
  if (*(long *)(in_RDI + 0x50) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lf_sync->lfdata");
  }
  *(undefined4 *)(in_RDI + 0x58) = in_R8D;
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    pvVar2 = aom_malloc(0x6debac);
    *(void **)(in_RDI + 0x30 + (long)local_28 * 8) = pvVar2;
    if (*(long *)(in_RDI + 0x30 + (long)local_28 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lf_sync->cur_sb_col[j]");
    }
  }
  pvVar2 = aom_malloc(0x6dec10);
  *(void **)(in_RDI + 0x68) = pvVar2;
  if (*(long *)(in_RDI + 0x68) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lf_sync->job_queue");
  }
  iVar1 = get_sync_range(in_ECX);
  *(int *)(in_RDI + 0x48) = iVar1;
  return;
}

Assistant:

void av1_loop_filter_alloc(AV1LfSync *lf_sync, AV1_COMMON *cm, int rows,
                           int width, int num_workers) {
  lf_sync->rows = rows;
#if CONFIG_MULTITHREAD
  {
    int i, j;

    for (j = 0; j < MAX_MB_PLANE; j++) {
      CHECK_MEM_ERROR(cm, lf_sync->mutex_[j],
                      aom_malloc(sizeof(*(lf_sync->mutex_[j])) * rows));
      if (lf_sync->mutex_[j]) {
        for (i = 0; i < rows; ++i) {
          pthread_mutex_init(&lf_sync->mutex_[j][i], NULL);
        }
      }

      CHECK_MEM_ERROR(cm, lf_sync->cond_[j],
                      aom_malloc(sizeof(*(lf_sync->cond_[j])) * rows));
      if (lf_sync->cond_[j]) {
        for (i = 0; i < rows; ++i) {
          pthread_cond_init(&lf_sync->cond_[j][i], NULL);
        }
      }
    }

    CHECK_MEM_ERROR(cm, lf_sync->job_mutex,
                    aom_malloc(sizeof(*(lf_sync->job_mutex))));
    if (lf_sync->job_mutex) {
      pthread_mutex_init(lf_sync->job_mutex, NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD
  CHECK_MEM_ERROR(cm, lf_sync->lfdata,
                  aom_malloc(num_workers * sizeof(*(lf_sync->lfdata))));
  lf_sync->num_workers = num_workers;

  for (int j = 0; j < MAX_MB_PLANE; j++) {
    CHECK_MEM_ERROR(cm, lf_sync->cur_sb_col[j],
                    aom_malloc(sizeof(*(lf_sync->cur_sb_col[j])) * rows));
  }
  CHECK_MEM_ERROR(
      cm, lf_sync->job_queue,
      aom_malloc(sizeof(*(lf_sync->job_queue)) * rows * MAX_MB_PLANE * 2));
  // Set up nsync.
  lf_sync->sync_range = get_sync_range(width);
}